

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5SorterNext(Fts5Cursor *pCsr)

{
  int iVar1;
  Fts5Sorter *pFVar2;
  int iVar3;
  uint uVar4;
  sqlite3_int64 sVar5;
  uchar *p;
  long lVar6;
  int iVar7;
  int iVal;
  uchar *local_40;
  Fts5Cursor *local_38;
  
  pFVar2 = pCsr->pSorter;
  iVar3 = sqlite3_step(pFVar2->pStmt);
  if (iVar3 == 0x65) {
    uVar4 = 1;
  }
  else {
    if (iVar3 != 100) {
      return iVar3;
    }
    iVar7 = 0;
    sVar5 = sqlite3_column_int64(pFVar2->pStmt,0);
    pFVar2->iRowid = sVar5;
    iVar3 = sqlite3_column_bytes(pFVar2->pStmt,1);
    p = (uchar *)sqlite3_column_blob(pFVar2->pStmt,1);
    uVar4 = 0x4e;
    if (0 < iVar3) {
      iVar1 = pFVar2->nIdx;
      local_40 = p;
      local_38 = pCsr;
      for (lVar6 = 0; lVar6 < (long)iVar1 + -1; lVar6 = lVar6 + 1) {
        uVar4 = sqlite3Fts5GetVarint32(p,(u32 *)&iVal);
        p = p + uVar4;
        iVar7 = iVar7 + iVal;
        pFVar2->aIdx[lVar6] = iVar7;
      }
      pFVar2->aIdx[lVar6] = ((int)local_40 + iVar3) - (int)p;
      pFVar2->aPoslist = p;
      uVar4 = 0x4e;
      pCsr = local_38;
    }
  }
  pCsr->csrflags = pCsr->csrflags | uVar4;
  return 0;
}

Assistant:

static int fts5SorterNext(Fts5Cursor *pCsr){
  Fts5Sorter *pSorter = pCsr->pSorter;
  int rc;

  rc = sqlite3_step(pSorter->pStmt);
  if( rc==SQLITE_DONE ){
    rc = SQLITE_OK;
    CsrFlagSet(pCsr, FTS5CSR_EOF);
  }else if( rc==SQLITE_ROW ){
    const u8 *a;
    const u8 *aBlob;
    int nBlob;
    int i;
    int iOff = 0;
    rc = SQLITE_OK;

    pSorter->iRowid = sqlite3_column_int64(pSorter->pStmt, 0);
    nBlob = sqlite3_column_bytes(pSorter->pStmt, 1);
    aBlob = a = sqlite3_column_blob(pSorter->pStmt, 1);

    /* nBlob==0 in detail=none mode. */
    if( nBlob>0 ){
      for(i=0; i<(pSorter->nIdx-1); i++){
        int iVal;
        a += fts5GetVarint32(a, iVal);
        iOff += iVal;
        pSorter->aIdx[i] = iOff;
      }
      pSorter->aIdx[i] = &aBlob[nBlob] - a;
      pSorter->aPoslist = a;
    }

    fts5CsrNewrow(pCsr);
  }

  return rc;
}